

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t encoder_set_config(aom_codec_alg_priv_t_conflict *ctx,aom_codec_enc_cfg_t *cfg)

{
  AV1EncoderConfig *oxcf;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  AV1_COMP *pAVar5;
  byte bVar6;
  aom_codec_err_t aVar7;
  undefined8 in_RAX;
  char *pcVar8;
  AV1_PRIMARY *pAVar9;
  byte bVar10;
  long lVar11;
  _Bool is_sb_size_changed;
  undefined8 uStack_38;
  
  uVar1 = cfg->g_w;
  if ((uVar1 != (ctx->cfg).g_w) || (bVar10 = false, cfg->g_h != (ctx->cfg).g_h)) {
    if ((1 < cfg->g_lag_in_frames) || (cfg->g_pass != AOM_RC_ONE_PASS)) {
      pcVar8 = "Cannot change width or height after initialization";
      goto LAB_00188281;
    }
    pAVar5 = ctx->ppi->cpi;
    bVar10 = false;
    if ((((pAVar5->svc).number_spatial_layers == 1) &&
        (iVar2 = pAVar5->last_coded_width, bVar10 = false, iVar2 != 0)) &&
       (iVar3 = pAVar5->last_coded_height, iVar3 != 0)) {
      uVar4 = cfg->g_h;
      bVar10 = iVar3 < (int)uVar4 ||
               ((iVar2 < (int)uVar1 || iVar3 * 0x10 < (int)uVar4) ||
               (iVar2 * 0x10 < (int)uVar1 || ((int)(uVar4 * 2) < iVar3 || (int)(uVar1 * 2) < iVar2))
               );
    }
  }
  if ((ctx->monochrome_on_init == true) && (cfg->monochrome == 0)) {
    pcVar8 = "Cannot change to monochrome = 0 after init with monochrome";
  }
  else {
    uVar1 = (ctx->cfg).g_lag_in_frames;
    if (uVar1 < cfg->g_lag_in_frames) {
      pcVar8 = "Cannot increase lag_in_frames";
    }
    else {
      if ((cfg->g_lag_in_frames == uVar1) || (ctx->num_lap_buffers < 1)) {
        uStack_38 = in_RAX;
        aVar7 = validate_config(ctx,cfg,&ctx->extra_cfg);
        if (aVar7 == AOM_CODEC_OK) {
          memcpy(&ctx->cfg,cfg,0x388);
          oxcf = &ctx->oxcf;
          set_encoder_config(oxcf,&ctx->cfg,&ctx->extra_cfg);
          uStack_38 = CONCAT17((ctx->ppi->seq_params).profile != (ctx->oxcf).profile,
                               (undefined7)uStack_38) & 0xff00ffffffffffff;
          av1_change_config_seq(ctx->ppi,oxcf,(_Bool *)((long)&uStack_38 + 6));
          pAVar9 = ctx->ppi;
          if (0 < pAVar9->num_fp_contexts) {
            lVar11 = 0;
            do {
              av1_change_config(pAVar9->parallel_cpi[lVar11],oxcf,uStack_38._6_1_);
              lVar11 = lVar11 + 1;
              pAVar9 = ctx->ppi;
            } while (lVar11 < pAVar9->num_fp_contexts);
          }
          bVar6 = uStack_38._7_1_;
          if (pAVar9->cpi_lap != (AV1_COMP *)0x0) {
            av1_change_config(pAVar9->cpi_lap,oxcf,uStack_38._6_1_);
          }
          bVar10 = bVar10 | bVar6;
        }
        if (bVar10 == 0) {
          return aVar7;
        }
        *(byte *)&ctx->next_frame_flags = (byte)ctx->next_frame_flags | 1;
        return aVar7;
      }
      pcVar8 = "Cannot change lag_in_frames if LAP is enabled";
    }
  }
LAB_00188281:
  (ctx->base).err_detail = pcVar8;
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t encoder_set_config(aom_codec_alg_priv_t *ctx,
                                          const aom_codec_enc_cfg_t *cfg) {
  aom_codec_err_t res;
  int force_key = 0;

  if (cfg->g_w != ctx->cfg.g_w || cfg->g_h != ctx->cfg.g_h) {
    if (cfg->g_lag_in_frames > 1 || cfg->g_pass != AOM_RC_ONE_PASS)
      ERROR("Cannot change width or height after initialization");
    // Note: function encoder_set_config() is allowed to be called multiple
    // times. However, when the original frame width or height is less than two
    // times of the new frame width or height, a forced key frame should be
    // used (for the case of single spatial layer, since otherwise a previous
    // encoded frame at a lower layer may be the desired reference). To make
    // sure the correct detection of a forced key frame, we need
    // to update the frame width and height only when the actual encoding is
    // performed. cpi->last_coded_width and cpi->last_coded_height are used to
    // track the actual coded frame size.
    if (ctx->ppi->cpi->svc.number_spatial_layers == 1 &&
        ctx->ppi->cpi->last_coded_width && ctx->ppi->cpi->last_coded_height &&
        (!valid_ref_frame_size(ctx->ppi->cpi->last_coded_width,
                               ctx->ppi->cpi->last_coded_height, cfg->g_w,
                               cfg->g_h) ||
         ((int)cfg->g_w > ctx->ppi->cpi->last_coded_width) ||
         ((int)cfg->g_h > ctx->ppi->cpi->last_coded_height))) {
      force_key = 1;
    }
  }

  if (ctx->monochrome_on_init && cfg->monochrome == 0) {
    // TODO(aomedia:3465): Allow this case to work without requiring re-init
    // of encoder.
    ERROR("Cannot change to monochrome = 0 after init with monochrome");
  }

  // Prevent increasing lag_in_frames. This check is stricter than it needs
  // to be -- the limit is not increasing past the first lag_in_frames
  // value, but we don't track the initial config, only the last successful
  // config.
  if (cfg->g_lag_in_frames > ctx->cfg.g_lag_in_frames)
    ERROR("Cannot increase lag_in_frames");
  // Prevent changing lag_in_frames if Lookahead Processing is enabled
  if (cfg->g_lag_in_frames != ctx->cfg.g_lag_in_frames &&
      ctx->num_lap_buffers > 0)
    ERROR("Cannot change lag_in_frames if LAP is enabled");

  res = validate_config(ctx, cfg, &ctx->extra_cfg);

  if (res == AOM_CODEC_OK) {
    ctx->cfg = *cfg;
    set_encoder_config(&ctx->oxcf, &ctx->cfg, &ctx->extra_cfg);
    // On profile change, request a key frame
    force_key |= ctx->ppi->seq_params.profile != ctx->oxcf.profile;
    bool is_sb_size_changed = false;
    av1_change_config_seq(ctx->ppi, &ctx->oxcf, &is_sb_size_changed);
    for (int i = 0; i < ctx->ppi->num_fp_contexts; i++) {
      av1_change_config(ctx->ppi->parallel_cpi[i], &ctx->oxcf,
                        is_sb_size_changed);
    }
    if (ctx->ppi->cpi_lap != NULL) {
      av1_change_config(ctx->ppi->cpi_lap, &ctx->oxcf, is_sb_size_changed);
    }
  }

  if (force_key) ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;

  return res;
}